

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::CommandLineInterface::GenerateOutput
          (CommandLineInterface *this,
          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *parsed_files,OutputDirective *output_directive,GeneratorContext *generator_context)

{
  bool bVar1;
  int iVar2;
  Edition minimum_edition;
  Edition maximum_edition;
  uint uVar3;
  LogMessage *pLVar4;
  ulong uVar5;
  ostream *poVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *in_R9;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  string_view plugin_prefix;
  string_view directive;
  bool local_149;
  string local_140 [8];
  string parameters_1;
  undefined1 local_118 [8];
  string parameters;
  undefined1 local_d8 [8];
  string plugin_name;
  LogMessage local_a8;
  Voidify local_91;
  string_view local_90;
  string_view local_80;
  string_view local_70;
  string_view local_60;
  undefined1 local_50 [8];
  string error;
  GeneratorContext *generator_context_local;
  OutputDirective *output_directive_local;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *parsed_files_local;
  CommandLineInterface *this_local;
  
  error.field_2._8_8_ = generator_context;
  std::__cxx11::string::string((string *)local_50);
  if (output_directive->generator == (CodeGenerator *)0x0) {
    local_60 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)output_directive);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_70,"--");
    bVar1 = absl::lts_20250127::StartsWith(local_60,local_70);
    plugin_name.field_2._M_local_buf[0xb] = '\0';
    local_149 = false;
    if (bVar1) {
      local_80 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view
                           ((string *)output_directive);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_90,"_out");
      local_149 = absl::lts_20250127::EndsWith(local_80,local_90);
    }
    if (((local_149 ^ 0xffU) & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface.cc"
                 ,0xa5d,
                 "absl::StartsWith(output_directive.name, \"--\") && absl::EndsWith(output_directive.name, \"_out\")"
                );
      plugin_name.field_2._M_local_buf[0xb] = '\x01';
      pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_a8);
      pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         (pLVar4,(char (*) [32])"Bad name for plugin generator: ");
      pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         (pLVar4,&output_directive->name);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_91,pLVar4);
    }
    if ((plugin_name.field_2._M_local_buf[0xb] & 1U) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_a8);
    }
    auVar7 = std::__cxx11::string::operator_cast_to_basic_string_view
                       ((string *)&this->plugin_prefix_);
    plugin_prefix._M_len = auVar7._8_8_;
    auVar8 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)output_directive);
    parameters.field_2._8_8_ = auVar8._0_8_;
    plugin_prefix._M_str = (char *)parameters.field_2._8_8_;
    directive._M_str = in_R9;
    directive._M_len = auVar8._8_8_;
    compiler::(anonymous_namespace)::PluginName_abi_cxx11_
              ((string *)local_d8,auVar7._0_8_,plugin_prefix,directive);
    std::__cxx11::string::string((string *)local_118,(string *)&output_directive->parameter);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::
    operator[]<std::__cxx11::string,absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>>
              ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&this->plugin_parameters_,(key_arg<std::__cxx11::basic_string<char>_> *)local_d8);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        std::__cxx11::string::append(local_118);
      }
      absl::lts_20250127::container_internal::
      raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::
      operator[]<std::__cxx11::string,absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>>
                ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)&this->plugin_parameters_,(key_arg<std::__cxx11::basic_string<char>_> *)local_d8
                );
      std::__cxx11::string::append((string *)local_118);
    }
    bVar1 = GeneratePluginOutput
                      (this,parsed_files,(string *)local_d8,(string *)local_118,
                       (GeneratorContext *)error.field_2._8_8_,(string *)local_50);
    if (!bVar1) {
      poVar6 = std::operator<<((ostream *)&std::cerr,(string *)output_directive);
      poVar6 = std::operator<<(poVar6,": ");
      poVar6 = std::operator<<(poVar6,(string *)local_50);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      this_local._7_1_ = 0;
    }
    parameters_1.field_2._13_3_ = 0;
    parameters_1.field_2._M_local_buf[0xc] = !bVar1;
    std::__cxx11::string::~string((string *)local_118);
    std::__cxx11::string::~string((string *)local_d8);
  }
  else {
    std::__cxx11::string::string(local_140,(string *)&output_directive->parameter);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::
    operator[]<std::__cxx11::string,absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>>
              ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&this->generator_parameters_,&output_directive->name);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        std::__cxx11::string::append((char *)local_140);
      }
      absl::lts_20250127::container_internal::
      raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::
      operator[]<std::__cxx11::string,absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>>
                ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)&this->generator_parameters_,&output_directive->name);
      std::__cxx11::string::append(local_140);
    }
    iVar2 = (*output_directive->generator->_vptr_CodeGenerator[4])();
    bVar1 = EnforceProto3OptionalSupport
                      (this,&output_directive->name,CONCAT44(extraout_var,iVar2),parsed_files);
    if (bVar1) {
      iVar2 = (*output_directive->generator->_vptr_CodeGenerator[4])();
      minimum_edition = (*output_directive->generator->_vptr_CodeGenerator[7])();
      maximum_edition = (*output_directive->generator->_vptr_CodeGenerator[8])();
      bVar1 = EnforceEditionsSupport
                        (this,&output_directive->name,CONCAT44(extraout_var_00,iVar2),
                         minimum_edition,maximum_edition,parsed_files);
      if (bVar1) {
        uVar3 = (*output_directive->generator->_vptr_CodeGenerator[3])
                          (output_directive->generator,parsed_files,local_140,error.field_2._8_8_,
                           local_50);
        if ((uVar3 & 1) == 0) {
          poVar6 = std::operator<<((ostream *)&std::cerr,(string *)output_directive);
          poVar6 = std::operator<<(poVar6,": ");
          poVar6 = std::operator<<(poVar6,(string *)local_50);
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          this_local._7_1_ = 0;
          parameters_1.field_2._12_4_ = 1;
        }
        else {
          parameters_1.field_2._12_4_ = 0;
        }
      }
      else {
        this_local._7_1_ = 0;
        parameters_1.field_2._12_4_ = 1;
      }
    }
    else {
      this_local._7_1_ = 0;
      parameters_1.field_2._12_4_ = 1;
    }
    std::__cxx11::string::~string(local_140);
  }
  if (parameters_1.field_2._12_4_ == 0) {
    this_local._7_1_ = 1;
    parameters_1.field_2._12_4_ = 1;
  }
  std::__cxx11::string::~string((string *)local_50);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool CommandLineInterface::GenerateOutput(
    const std::vector<const FileDescriptor*>& parsed_files,
    const OutputDirective& output_directive,
    GeneratorContext* generator_context) {
  // Call the generator.
  std::string error;
  if (output_directive.generator == nullptr) {
    // This is a plugin.
    ABSL_CHECK(absl::StartsWith(output_directive.name, "--") &&
               absl::EndsWith(output_directive.name, "_out"))
        << "Bad name for plugin generator: " << output_directive.name;

    std::string plugin_name = PluginName(plugin_prefix_, output_directive.name);
    std::string parameters = output_directive.parameter;
    if (!plugin_parameters_[plugin_name].empty()) {
      if (!parameters.empty()) {
        parameters.append(",");
      }
      parameters.append(plugin_parameters_[plugin_name]);
    }
    if (!GeneratePluginOutput(parsed_files, plugin_name, parameters,
                              generator_context, &error)) {
      std::cerr << output_directive.name << ": " << error << std::endl;
      return false;
    }
  } else {
    // Regular generator.
    std::string parameters = output_directive.parameter;
    if (!generator_parameters_[output_directive.name].empty()) {
      if (!parameters.empty()) {
        parameters.append(",");
      }
      parameters.append(generator_parameters_[output_directive.name]);
    }
    if (!EnforceProto3OptionalSupport(
            output_directive.name,
            output_directive.generator->GetSupportedFeatures(), parsed_files)) {
      return false;
    }

    if (!EnforceEditionsSupport(
            output_directive.name,
            output_directive.generator->GetSupportedFeatures(),
            output_directive.generator->GetMinimumEdition(),
            output_directive.generator->GetMaximumEdition(), parsed_files)) {
      return false;
    }

    if (!output_directive.generator->GenerateAll(parsed_files, parameters,
                                                 generator_context, &error)) {
      // Generator returned an error.
      std::cerr << output_directive.name << ": " << error << std::endl;
      return false;
    }
  }

  return true;
}